

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSharedPPData.cpp
# Opt level: O1

void __thiscall
SharedPPDataTest_testPropertyDeallocation_Test::TestBody
          (SharedPPDataTest_testPropertyDeallocation_Test *this)

{
  bool bVar1;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  TestType *pTVar3;
  Base *pBVar4;
  Base **ppBVar5;
  char *message;
  char *in_R9;
  TestType *pTVar6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  TestType *pip;
  TestType *out;
  AssertHelper local_68;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [32];
  TestType *local_28;
  TestType *local_20;
  
  this_00 = (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
             *)operator_new(0x30);
  p_Var2 = &(this_00->_M_impl).super__Rb_tree_header;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->_M_impl).super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&this_00->_M_impl = 0;
  *(undefined8 *)&(this_00->_M_impl).super__Rb_tree_header._M_header = 0;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pTVar6 = (TestType *)0x0;
  (this_00->_M_impl).super__Rb_tree_header._M_node_count = 0;
  destructed = '\0';
  pTVar3 = (TestType *)operator_new(1);
  local_28 = pTVar3;
  pBVar4 = (Base *)operator_new(0x10);
  pBVar4->_vptr_Base = (_func_int **)&PTR__THeapData_008ffec8;
  pBVar4[1]._vptr_Base = (_func_int **)pTVar3;
  SetGenericPropertyPtr<Assimp::SharedPostProcessInfo::Base>
            ((map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
              *)this_00,"quak",pBVar4,(bool *)0x0);
  local_48._0_8_ = (Base *)0x0;
  ppBVar5 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                      ((map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
                        *)this_00,"quak",(Base **)local_48);
  pBVar4 = *ppBVar5;
  if (pBVar4 != (Base *)0x0) {
    pTVar6 = (TestType *)pBVar4[1]._vptr_Base;
  }
  local_58.ptr_._0_1_ = pBVar4 != (Base *)0x0;
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20 = pTVar6;
  if (pBVar4 == (Base *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_58,
               (AssertionResult *)"localShared->GetProperty(\"quak\",out)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x77,(char *)local_48._0_8_);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((Base *)local_48._0_8_ != (Base *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<TestType*,TestType*>
            ((internal *)local_48,"pip","out",&local_28,&local_20);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_48._8_8_ == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_48._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x78,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_48 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Assimp::SharedPostProcessInfo::Clean((SharedPostProcessInfo *)this_00);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  ::~_Rb_tree(this_00);
  operator_delete(this_00);
  local_58.ptr_._0_1_ = destructed;
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (destructed == '\0') {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_58,(AssertionResult *)"destructed","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x7b,(char *)local_48._0_8_);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((Base *)local_48._0_8_ != (Base *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(SharedPPDataTest, testPropertyDeallocation)
{
	SharedPostProcessInfo* localShared = new SharedPostProcessInfo();
	destructed = false;

	TestType *out, * pip = new TestType();
	localShared->AddProperty("quak",pip);
    EXPECT_TRUE(localShared->GetProperty("quak",out));
    EXPECT_EQ(pip, out);

    delete localShared;
    EXPECT_TRUE(destructed);
}